

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

_Bool av1_cnn_predict_c(float **input,int in_width,int in_height,int in_stride,
                       CNN_CONFIG *cnn_config,CNN_THREAD_DATA *thread_data,
                       CNN_MULTI_OUT *output_struct)

{
  CNN_LAYER_CONFIG *layer_config;
  AVxWorker *pAVar1;
  AVxWorker *pAVar2;
  float *pfVar3;
  CNN_THREAD_DATA *pCVar4;
  _Bool _Var5;
  AVxWorkerInterface *pAVar6;
  int iVar7;
  float **ppfVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  TENSOR *pTVar13;
  TENSOR *pTVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int b;
  uint uVar22;
  long lVar23;
  int o_height;
  int o_width;
  float **output [4];
  TENSOR tensor2 [4];
  CONVOLVE_OPS convolve_ops [32];
  int local_5200;
  int local_51fc;
  int local_51f8;
  int local_51f4;
  ulong local_51f0;
  int local_51e8;
  int local_51e4;
  int local_51e0;
  int local_51dc;
  ulong local_51d8;
  ulong local_51d0;
  long local_51c8;
  float **local_51c0;
  CNN_THREAD_DATA *local_51b8;
  int local_51ac;
  int local_51a8;
  int local_51a4;
  int local_51a0;
  int local_519c;
  float **local_5198;
  int *local_5190;
  long local_5188;
  CNN_CONFIG *local_5180;
  CNN_LAYER_CONFIG *local_5178;
  long local_5170;
  float **local_5168;
  ulong local_5160;
  float **local_5158;
  long alStack_5150 [3];
  TENSOR local_5138 [4];
  TENSOR local_30d0;
  long local_28b8;
  int local_28b0 [4];
  long local_28a0 [2];
  int local_2890 [510];
  TENSOR local_2098 [4];
  
  local_51e8 = in_width;
  local_51e4 = in_height;
  local_51ac = in_stride;
  local_5198 = input;
  memset(local_5138,0,0x2060);
  piVar11 = output_struct->output_channels;
  local_5158 = output_struct->output_buffer;
  iVar10 = output_struct->num_outputs;
  if (1 < (long)iVar10) {
    lVar16 = 0;
    ppfVar8 = local_5158;
    do {
      ppfVar8 = ppfVar8 + piVar11[lVar16];
      alStack_5150[lVar16] = (long)ppfVar8;
      lVar16 = lVar16 + 1;
    } while ((long)iVar10 + -1 != lVar16);
  }
  local_51f4 = 0;
  local_51f8 = 0;
  memset(local_2098,0,0x2060);
  memset(local_5138,0,0x2060);
  if (0 < cnn_config->num_layers) {
    local_5190 = output_struct->output_strides;
    local_5178 = cnn_config->layer_config;
    lVar16 = 0;
    local_51fc = local_51e8;
    local_5200 = local_51e4;
    local_51b8 = thread_data;
    local_5180 = cnn_config;
    do {
      pCVar4 = local_51b8;
      layer_config = local_5178 + lVar16;
      iVar10 = local_5178[lVar16].branch;
      uVar18 = (ulong)iVar10;
      lVar23 = uVar18 * 0x818;
      pTVar14 = local_2098 + uVar18;
      local_5170 = lVar16;
      if (lVar16 == 0) {
        uVar22 = layer_config->in_channels;
        pTVar14->allocsize = 0;
        local_2098[uVar18].channels = uVar22;
        local_2098[uVar18].width = local_51e8;
        local_2098[uVar18].height = local_51e4;
        local_2098[uVar18].stride = local_51ac;
        if (local_5198 == (float **)0x0) {
          if (0 < (int)uVar22) {
            memset(local_2098[uVar18].buf,0,(ulong)uVar22 << 3);
          }
        }
        else if (0 < (int)uVar22) {
          memcpy(local_2098[uVar18].buf,local_5198,(ulong)uVar22 << 3);
        }
      }
      else {
        memcpy(&local_28b8,pTVar14,0x818);
        memcpy(pTVar14,local_5138 + uVar18,0x818);
        memcpy(local_5138 + uVar18,&local_28b8,0x818);
        local_51fc = local_2098[uVar18].width;
        local_5200 = local_2098[uVar18].height;
      }
      av1_find_cnn_layer_output_size(local_51fc,local_5200,layer_config,&local_51f4,&local_51f8);
      lVar16 = (long)layer_config->output_num;
      pTVar13 = local_5138 + uVar18;
      if (lVar16 == -1) {
        local_51dc = local_51f4;
        local_51e0 = local_51f8;
        _Var5 = realloc_tensor(pTVar13,layer_config->out_channels,local_51f4,local_51f8);
        if (_Var5) goto LAB_003b8c09;
LAB_003b91dc:
        _Var5 = false;
        goto LAB_003b91de;
      }
      if (pTVar13->allocsize != 0) {
        aom_free(local_5138[uVar18].buf[0]);
        local_5138[uVar18].buf[0] = (float *)0x0;
        pTVar13->allocsize = 0;
      }
      lVar12 = alStack_5150[lVar16 + -1];
      uVar22 = layer_config->out_channels;
      iVar15 = local_5190[lVar16];
      pTVar13->allocsize = 0;
      local_5138[uVar18].channels = uVar22;
      local_5138[uVar18].width = local_51f4;
      local_5138[uVar18].height = local_51f8;
      local_5138[uVar18].stride = iVar15;
      local_51dc = local_51f4;
      local_51e0 = local_51f8;
      if (lVar12 == 0) {
        if (0 < (int)uVar22) {
          memset(local_5138[uVar18].buf,0,(ulong)uVar22 << 3);
        }
      }
      else if (0 < (int)uVar22) {
        uVar9 = 0;
        do {
          local_5138[uVar18].buf[uVar9] = *(float **)(lVar12 + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while (uVar22 != uVar9);
      }
LAB_003b8c09:
      if ((layer_config->branch_copy_type == '\x01') &&
         (_Var5 = copy_active_tensor_to_branches(pTVar14,layer_config,iVar10,local_5138), !_Var5))
      goto LAB_003b91dc;
      uVar9 = uVar18;
      if (layer_config->deconvolve == 0) {
        if (pCVar4->num_workers < 2) {
          av1_cnn_convolve(local_2098[uVar18].buf,local_2098[uVar18].width,local_2098[uVar18].height
                           ,local_2098[uVar18].stride,layer_config,local_5138[uVar18].buf,
                           local_5138[uVar18].stride,0,1);
        }
        else {
          local_51f0 = uVar18;
          local_51c8 = lVar16;
          local_51c0 = local_2098[uVar18].buf;
          local_51a8 = local_5138[uVar18].stride;
          local_51a4 = local_2098[uVar18].stride;
          local_51a0 = local_2098[uVar18].height;
          local_519c = local_2098[uVar18].width;
          local_5188 = lVar23;
          pAVar6 = aom_get_worker_interface();
          uVar22 = pCVar4->num_workers;
          local_51d0 = (ulong)uVar22;
          lVar16 = local_51c8;
          uVar9 = local_51f0;
          lVar23 = local_5188;
          if (0 < (int)uVar22) {
            local_51d8 = 0x20;
            if (uVar22 < 0x20) {
              local_51d8 = local_51d0;
            }
            local_5160 = (ulong)(uVar22 - 1);
            lVar16 = 0;
            uVar9 = 0;
            local_5168 = local_5138[uVar18].buf;
            do {
              pAVar2 = local_51b8->workers;
              pAVar1 = (AVxWorker *)((long)&pAVar2->impl_ + lVar16);
              (*pAVar6->reset)(pAVar1);
              *(long *)((long)&local_28b8 + lVar16) = (long)local_51c0;
              *(int *)((long)local_28b0 + lVar16) = local_519c;
              *(int *)((long)local_28b0 + lVar16 + 4) = local_51a0;
              *(int *)((long)local_28b0 + lVar16 + 8) = local_51a4;
              *(CNN_LAYER_CONFIG **)((long)local_28a0 + lVar16) = layer_config;
              *(float ***)((long)local_28a0 + lVar16 + 8) = local_5168;
              *(int *)((long)local_2890 + lVar16) = local_51a8;
              *(int *)((long)local_2890 + lVar16 + 4) = (int)uVar9;
              *(int *)((long)local_2890 + lVar16 + 8) = (int)local_51d0;
              *(code **)((long)&pAVar2->hook + lVar16) = convolve_layer;
              *(long **)((long)&pAVar2->data1 + lVar16) = (long *)((long)&local_28b8 + lVar16);
              *(undefined8 *)((long)&pAVar2->data2 + lVar16) = 0;
              (*(&pAVar6->launch)[local_5160 == uVar9])(pAVar1);
              pCVar4 = local_51b8;
              uVar9 = uVar9 + 1;
              lVar16 = lVar16 + 0x38;
            } while (local_51d8 != uVar9);
            lVar12 = local_51d8 * 0x38;
            lVar19 = 0;
            do {
              (*pAVar6->sync)((AVxWorker *)((long)&pCVar4->workers->impl_ + lVar19));
              lVar19 = lVar19 + 0x38;
              lVar16 = local_51c8;
              uVar9 = local_51f0;
              lVar23 = local_5188;
            } while (lVar12 - lVar19 != 0);
          }
        }
      }
      else {
        av1_cnn_deconvolve_c
                  (local_2098[uVar18].buf,local_2098[uVar18].width,local_2098[uVar18].height,
                   local_2098[uVar18].stride,layer_config,local_5138[uVar18].buf,
                   local_5138[uVar18].stride);
      }
      if ((layer_config->branch_copy_type == '\x02') &&
         (_Var5 = copy_active_tensor_to_branches(pTVar13,layer_config,(int)uVar9,local_5138), !_Var5
         )) goto LAB_003b91dc;
      if (layer_config->branch_combine_type == '\x01') {
        ppfVar8 = local_5138[0].buf;
        uVar21 = 0;
        local_51c8 = lVar16;
        do {
          if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar21 & 0x1f) & 1
               ) != 0) && ((uVar9 & 0xffffffff) != uVar21)) {
            av1_cnn_add_c((float **)((long)local_5138[0].buf + lVar23),local_5138[uVar18].channels,
                          local_5138[uVar18].width,local_5138[uVar18].height,
                          local_5138[uVar18].stride,ppfVar8);
          }
          uVar21 = uVar21 + 1;
          ppfVar8 = ppfVar8 + 0x103;
          lVar16 = local_51c8;
        } while (uVar21 != 4);
      }
      pTVar14 = local_5138 + uVar9;
      ppfVar8 = local_5138[uVar9].buf;
      local_51f0 = uVar9;
      av1_cnn_activate_c(ppfVar8,local_5138[uVar9].channels,local_5138[uVar9].width,
                         local_5138[uVar9].height,local_5138[uVar9].stride,layer_config->activation)
      ;
      pfVar3 = (layer_config->bn_params).bn_gamma;
      if (pfVar3 != (float *)0x0) {
        av1_cnn_batchnorm_c(ppfVar8,local_5138[uVar9].channels,local_5138[uVar9].width,
                            local_5138[uVar9].height,local_5138[uVar9].stride,pfVar3,
                            (layer_config->bn_params).bn_beta,(layer_config->bn_params).bn_mean,
                            (layer_config->bn_params).bn_std);
      }
      if (layer_config->branch_combine_type == '\x02') {
        if ((int)lVar16 == -1) {
          local_51d0 = local_51f0 & 0xffffffff;
          uVar18 = 0;
          do {
            if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar18 & 0x1f) &
                 1) != 0) && (uVar18 != local_51d0)) {
              iVar10 = local_5138[uVar9].channels;
              uVar22 = local_5138[uVar18].channels + iVar10;
              iVar15 = local_5138[uVar9].width;
              iVar7 = local_5138[uVar9].height;
              ppfVar8 = (float **)(uVar18 * 0x818);
              if (pTVar14->allocsize < (int)(iVar15 * iVar7 * uVar22)) {
                local_51d8 = CONCAT44(local_51d8._4_4_,iVar10);
                local_51c0 = (float **)(uVar18 * 0x818);
                memset(&local_30d0,0,0x818);
                _Var5 = realloc_tensor(&local_30d0,uVar22,iVar15,iVar7);
                if (!_Var5) goto LAB_003b91dc;
                copy_tensor(pTVar14,local_5138[uVar9].channels,0,&local_30d0);
                memcpy(&local_28b8,pTVar14,0x818);
                memcpy(pTVar14,&local_30d0,0x818);
                memcpy(&local_30d0,&local_28b8,0x818);
                if (local_30d0.allocsize != 0) {
                  aom_free(local_30d0.buf[0]);
                }
                ppfVar8 = local_51c0;
                iVar10 = (int)local_51d8;
              }
              if (1 < (int)uVar22) {
                pfVar3 = local_5138[uVar9].buf[0];
                iVar7 = local_5138[uVar9].height * local_5138[uVar9].width;
                lVar16 = 0;
                iVar15 = iVar7;
                do {
                  local_5138[uVar9].buf[lVar16 + 1] = pfVar3 + iVar15;
                  lVar16 = lVar16 + 1;
                  iVar15 = iVar15 + iVar7;
                } while ((ulong)uVar22 - 1 != lVar16);
              }
              copy_tensor((TENSOR *)((long)ppfVar8 + (long)(local_5138[0].buf + -3)),
                          *(int *)((long)&local_5138[0].channels + (long)ppfVar8),iVar10,pTVar14);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != 4);
        }
        else {
          uVar21 = (ulong)(uint)local_5138[uVar9].channels;
          uVar20 = local_51f0 & 0xffffffff;
          piVar11 = &local_5138[0].channels;
          uVar17 = 0;
          uVar18 = uVar21;
          do {
            if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar17 & 0x1f) &
                 1) != 0) && (uVar20 != uVar17)) {
              uVar18 = (ulong)(uint)((int)uVar18 + *piVar11);
            }
            uVar17 = uVar17 + 1;
            piVar11 = piVar11 + 0x206;
          } while (uVar17 != 4);
          lVar23 = alStack_5150[lVar16 + -1];
          iVar10 = local_5190[lVar16];
          pTVar14->allocsize = 0;
          iVar15 = (int)uVar18;
          local_5138[uVar9].channels = iVar15;
          local_5138[uVar9].width = local_51dc;
          local_5138[uVar9].height = local_51e0;
          local_5138[uVar9].stride = iVar10;
          if (lVar23 == 0) {
            if (0 < iVar15) {
              memset(ppfVar8,0,uVar18 << 3);
            }
          }
          else if (0 < iVar15) {
            uVar9 = 0;
            do {
              ppfVar8[uVar9] = *(float **)(lVar23 + uVar9 * 8);
              uVar9 = uVar9 + 1;
            } while (uVar18 != uVar9);
          }
          pTVar13 = local_5138;
          uVar18 = 0;
          do {
            if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar18 & 0x1f) &
                 1) != 0) && (uVar20 != uVar18)) {
              copy_tensor(pTVar13,pTVar13->channels,(int)uVar21,pTVar14);
              uVar21 = (ulong)(uint)((int)uVar21 + pTVar13->channels);
            }
            uVar18 = uVar18 + 1;
            pTVar13 = pTVar13 + 1;
          } while (uVar18 != 4);
        }
      }
      if ((layer_config->branch_copy_type == '\x03') &&
         (_Var5 = copy_active_tensor_to_branches(pTVar14,layer_config,(int)local_51f0,local_5138),
         !_Var5)) goto LAB_003b91dc;
      lVar16 = local_5170 + 1;
    } while (lVar16 < local_5180->num_layers);
  }
  _Var5 = true;
LAB_003b91de:
  lVar16 = 0;
  do {
    if (*(int *)((long)local_2098[0].buf + lVar16 + -0x18) != 0) {
      aom_free(*(void **)((long)local_2098[0].buf + lVar16));
      *(undefined8 *)((long)local_2098[0].buf + lVar16) = 0;
      *(undefined4 *)((long)local_2098[0].buf + lVar16 + -0x18) = 0;
    }
    if (*(int *)((long)local_5138[0].buf + lVar16 + -0x18) != 0) {
      aom_free(*(void **)((long)local_5138[0].buf + lVar16));
      *(undefined8 *)((long)local_5138[0].buf + lVar16) = 0;
      *(undefined4 *)((long)local_5138[0].buf + lVar16 + -0x18) = 0;
    }
    lVar16 = lVar16 + 0x818;
  } while (lVar16 != 0x2060);
  return _Var5;
}

Assistant:

bool av1_cnn_predict_c(const float **input, int in_width, int in_height,
                       int in_stride, const CNN_CONFIG *cnn_config,
                       const CNN_THREAD_DATA *thread_data,
                       CNN_MULTI_OUT *output_struct) {
  bool success = false;
  TENSOR tensor1[CNN_MAX_BRANCHES] = { { 0 } };
  TENSOR tensor2[CNN_MAX_BRANCHES] = { { 0 } };

  float **output[CNN_MAX_BRANCHES];
  const int *out_chs = output_struct->output_channels;
  output[0] = output_struct->output_buffer;
  for (int out_idx = 1; out_idx < output_struct->num_outputs; out_idx++) {
    output[out_idx] = output[out_idx - 1] + out_chs[out_idx - 1];
  }

  int i_width = in_width;
  int i_height = in_height;
  int o_width = 0, o_height = 0;
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    init_tensor(&tensor1[b]);
    init_tensor(&tensor2[b]);
  }

  const int *out_stride = output_struct->output_strides;
  for (int layer = 0; layer < cnn_config->num_layers; ++layer) {
    const CNN_LAYER_CONFIG *layer_config = &cnn_config->layer_config[layer];
    const int branch = layer_config->branch;
    const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;

    // Allocate input tensor
    if (layer == 0) {       // First layer
      assert(branch == 0);  // First layer must be primary branch
      assign_tensor(&tensor1[branch], (float **)input,
                    layer_config->in_channels, in_width, in_height, in_stride);
    } else {  // Non-first layer
      // Swap tensor1 and tensor2
      swap_tensor(&tensor1[branch], &tensor2[branch]);

      i_width = tensor1[branch].width;
      i_height = tensor1[branch].height;
    }

    // Allocate output tensor
    av1_find_cnn_layer_output_size(i_width, i_height, layer_config, &o_width,
                                   &o_height);
    const int output_num = layer_config->output_num;
    if (output_num == -1) {  // Non-output layer
      if (!realloc_tensor(&tensor2[branch], layer_config->out_channels, o_width,
                          o_height)) {
        goto Error;
      }
    } else {  // Output layer
      free_tensor(&tensor2[branch]);
      assign_tensor(&tensor2[branch], output[output_num],
                    layer_config->out_channels, o_width, o_height,
                    out_stride[output_num]);
    }

    // If we are combining branches make sure that the branch to combine
    // is different from the current branch.
    assert(IMPLIES(layer_config->branch_combine_type != BRANCH_NOC,
                   !(branch_config->branches_to_combine & (1 << branch))));

    if (layer_config->branch_copy_type == BRANCH_INPUT) {
      if (!copy_active_tensor_to_branches(&tensor1[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }
    // Check consistency of input and output channels
    assert(tensor1[branch].channels == layer_config->in_channels);
    assert(tensor2[branch].channels == layer_config->out_channels);

    // Convolve/Deconvolve
    if (!cnn_config->layer_config[layer].deconvolve) {
      if (thread_data->num_workers > 1) {
        convolve_layer_mt((const float **)tensor1[branch].buf,
                          tensor1[branch].width, tensor1[branch].height,
                          tensor1[branch].stride, layer_config, thread_data,
                          tensor2[branch].buf, tensor2[branch].stride);
      } else {
        av1_cnn_convolve((const float **)tensor1[branch].buf,
                         tensor1[branch].width, tensor1[branch].height,
                         tensor1[branch].stride, layer_config,
                         tensor2[branch].buf, tensor2[branch].stride, 0, 1);
      }
    } else {
      av1_cnn_deconvolve((const float **)tensor1[branch].buf,
                         tensor1[branch].width, tensor1[branch].height,
                         tensor1[branch].stride, layer_config,
                         tensor2[branch].buf, tensor2[branch].stride);
    }

    if (layer_config->branch_copy_type == BRANCH_OUTPUT) {
      if (!copy_active_tensor_to_branches(&tensor2[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }

    // Add tensors from other branches if needed
    if (layer_config->branch_combine_type == BRANCH_ADD) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
          assert(check_tensor_equal_size(&tensor2[b], &tensor2[branch]));
          av1_cnn_add(tensor2[branch].buf, tensor2[branch].channels,
                      tensor2[branch].width, tensor2[branch].height,
                      tensor2[branch].stride, (const float **)tensor2[b].buf);
        }
      }
    }

    // Non-linearity
    av1_cnn_activate(tensor2[branch].buf, tensor2[branch].channels,
                     tensor2[branch].width, tensor2[branch].height,
                     tensor2[branch].stride, layer_config->activation);

    if (layer_config->bn_params.bn_gamma) {
      av1_cnn_batchnorm(
          tensor2[branch].buf, tensor2[branch].channels, tensor2[branch].width,
          tensor2[branch].height, tensor2[branch].stride,
          layer_config->bn_params.bn_gamma, layer_config->bn_params.bn_beta,
          layer_config->bn_params.bn_mean, layer_config->bn_params.bn_std);
    }

    // Concatenate tensors
    if (layer_config->branch_combine_type == BRANCH_CAT) {
      if (output_num == -1) {  // Non-output layer
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            assert(tensor2[b].channels > 0);
            if (!concat_tensor(&tensor2[b], &tensor2[branch])) goto Error;
          }
        }
      } else {  // Output layer
        const int existing_channels = tensor2[branch].channels;
        int num_chs = existing_channels;
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            // Needed only to assign the new channel buffers
            num_chs += tensor2[b].channels;
          }
        }
        assign_tensor(&tensor2[branch], output[output_num], num_chs, o_width,
                      o_height, out_stride[output_num]);

        num_chs = existing_channels;
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            // Needed only to assign the new channel buffers
            copy_tensor(&tensor2[b], tensor2[b].channels, num_chs,
                        &tensor2[branch]);
            num_chs += tensor2[b].channels;
          }
        }
      }
    }

    if (layer_config->branch_copy_type == BRANCH_COMBINED) {
      if (!copy_active_tensor_to_branches(&tensor2[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }
  }

  success = true;
Error:
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    free_tensor(&tensor1[b]);
    free_tensor(&tensor2[b]);
  }
  return success;
}